

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkAbs2(Wlc_Ntk_t *pNtk,Vec_Int_t *vBlacks,Vec_Int_t **pvFlops)

{
  Vec_Int_t *p;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Ntk_t *p_03;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  int *piVar8;
  Wlc_Ntk_t *pWVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntDup(vBlacks);
  p_02 = Vec_IntStart(pNtk->iObj);
  iVar10 = pNtk->iObj;
  p_03 = Wlc_NtkDupDfsSimple(pNtk);
  for (iVar11 = 0; iVar11 < (pNtk->vCis).nSize; iVar11 = iVar11 + 1) {
    pWVar6 = Wlc_NtkCi(pNtk,iVar11);
    if ((undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x1) {
      Vec_IntPush(p_00,(int)(((long)pWVar6 - (long)pNtk->pObjs) / 0x18));
    }
  }
  iVar11 = p_01->nSize;
  iVar12 = 0;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
    iVar3 = Vec_IntEntry(p_01,iVar12);
    pWVar6 = Wlc_NtkObj(pNtk,iVar3);
    iVar3 = Vec_IntEntry(&pNtk->vCopies,(int)(((long)pWVar6 - (long)pNtk->pObjs) / 0x18));
    Vec_IntWriteEntry(p_01,iVar12,iVar3);
  }
  iVar12 = 1;
  for (iVar3 = 0; iVar11 != iVar3; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(p_01,iVar3);
    pWVar7 = Wlc_NtkObj(p_03,iVar4);
    pWVar6 = p_03->pObjs;
    uVar2 = *(uint *)pWVar7;
    *(ushort *)pWVar7 = (ushort)uVar2 | 0x80;
    iVar5 = pWVar7->End - pWVar7->Beg;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = Wlc_ObjAlloc(p_03,1,uVar2 >> 6 & 1,iVar4,0);
    Vec_IntWriteEntry(p_02,(int)(((long)pWVar7 - (long)pWVar6) / 0x18),iVar4);
  }
  Wlc_NtkCleanCopy(p_03);
  p = &p_03->vCopies;
  for (; (iVar12 < p_03->iObj && (pWVar6 = Wlc_NtkObj(p_03,iVar12), iVar12 != iVar10));
      iVar12 = iVar12 + 1) {
    if ((char)*(ushort *)pWVar6 < '\0') {
      *(ushort *)pWVar6 = *(ushort *)pWVar6 & 0xff7f;
      iVar11 = Vec_IntEntry(p_02,iVar12);
    }
    else {
      for (lVar13 = 0; iVar11 = iVar12, lVar13 < (int)pWVar6->nFanins; lVar13 = lVar13 + 1) {
        iVar11 = Wlc_ObjFaninId(pWVar6,(int)lVar13);
        iVar11 = Vec_IntEntry(p,iVar11);
        piVar8 = Wlc_ObjFanins(pWVar6);
        piVar8[lVar13] = iVar11;
      }
    }
    Vec_IntWriteEntry(p,iVar12,iVar11);
  }
  for (iVar10 = 0; iVar10 < (p_03->vCos).nSize; iVar10 = iVar10 + 1) {
    pWVar6 = Wlc_NtkCo(p_03,iVar10);
    iVar12 = (int)(((long)pWVar6 - (long)p_03->pObjs) / 0x18);
    iVar11 = Vec_IntEntry(p,iVar12);
    if (iVar11 != iVar12) {
      uVar1 = *(ushort *)pWVar6;
      iVar11 = Vec_IntEntry(p,iVar12);
      pWVar6 = Wlc_NtkObj(p_03,iVar11);
      *(ushort *)pWVar6 = *(ushort *)pWVar6 | (short)((uVar1 & 0x400) >> 1) + 0x200U;
      iVar11 = Vec_IntEntry(p,iVar12);
      Vec_IntWriteEntry(&p_03->vCos,iVar10,iVar11);
    }
  }
  pWVar9 = Wlc_NtkDupDfsSimple(p_03);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  Wlc_NtkFree(p_03);
  Vec_IntFree(p_00);
  return pWVar9;
}

Assistant:

static Wlc_Ntk_t * Wlc_NtkAbs2( Wlc_Ntk_t * pNtk, Vec_Int_t * vBlacks, Vec_Int_t ** pvFlops )
{
    Vec_Int_t * vFlops  = Vec_IntAlloc( 100 );
    Vec_Int_t * vNodes  = Vec_IntDup( vBlacks );
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    Vec_Int_t * vMapNode2Pi = Vec_IntStart( Wlc_NtkObjNumMax(pNtk) );
    int nOrigObjNum = Wlc_NtkObjNumMax( pNtk );
    Wlc_Ntk_t * p = Wlc_NtkDupDfsSimple( pNtk );

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( !Wlc_ObjIsPi( pObj ) )
            Vec_IntPush( vFlops, Wlc_ObjId( pNtk, pObj ) ); 
    }

    Wlc_NtkForEachObjVec( vNodes, pNtk, pObj, i ) 
        Vec_IntWriteEntry(vNodes, i, Wlc_ObjCopy(pNtk, Wlc_ObjId(pNtk, pObj)));

    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i ) 
    {
        iObj = Wlc_ObjId(p, pObj);
        pObj->Mark = 1;
        // add fresh PI with the same number of bits
        Vec_IntWriteEntry( vMapNode2Pi, iObj, Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 ) );
    }

    Wlc_NtkCleanCopy( p );

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == nOrigObjNum ) 
            break;

        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            iObj = Vec_IntEntry( vMapNode2Pi, i );
        }
        else {
            // update fanins
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }

    Wlc_NtkForEachCo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        if (iObj != Wlc_ObjCopy(p, iObj)) 
        {
            if (pObj->fIsFi)
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsFi = 1;
            else
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsPo = 1;


            Vec_IntWriteEntry(&p->vCos, i, Wlc_ObjCopy(p, iObj));
        }
    }

    pNew = Wlc_NtkDupDfsSimple( p );
    Vec_IntFree( vMapNode2Pi );
    Vec_IntFree( vNodes );
    Wlc_NtkFree( p );

    if ( pvFlops )
        *pvFlops = vFlops;
    else
        Vec_IntFree( vFlops );

    return pNew;
}